

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxList.cpp
# Opt level: O3

void amrex::anon_unknown_23::chop_boxes_dir(Box *bxv,Box *bx,int nboxes,int idir)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  int iVar4;
  int iVar5;
  IntVect sm;
  Box bxleft;
  int local_78 [4];
  Box local_68;
  Box local_48;
  
  if (nboxes == 1) {
    uVar1 = *(undefined8 *)(bx->smallend).vect;
    uVar2 = *(undefined8 *)((bx->smallend).vect + 2);
    uVar3 = *(undefined8 *)((bx->bigend).vect + 2);
    *(undefined8 *)(bxv->bigend).vect = *(undefined8 *)(bx->bigend).vect;
    *(undefined8 *)((bxv->bigend).vect + 2) = uVar3;
    *(undefined8 *)(bxv->smallend).vect = uVar1;
    *(undefined8 *)((bxv->smallend).vect + 2) = uVar2;
  }
  else {
    iVar5 = (bx->smallend).vect[idir];
    iVar4 = (bx->bigend).vect[idir] - iVar5;
    iVar5 = ((iVar4 - (iVar4 + 1 >> 0x1f)) + 1 >> 1) + iVar5;
    local_68.smallend.vect._0_8_ = *(undefined8 *)(bx->smallend).vect;
    uVar1 = *(undefined8 *)((bx->smallend).vect + 2);
    local_68._20_8_ = *(undefined8 *)((bx->bigend).vect + 2);
    local_68.bigend.vect[1] = (int)((ulong)*(undefined8 *)(bx->bigend).vect >> 0x20);
    local_68.smallend.vect[2] = (int)uVar1;
    local_68.bigend.vect[0] = (int)((ulong)uVar1 >> 0x20);
    local_78[2] = (bx->smallend).vect[2];
    local_78._0_8_ = *(undefined8 *)(bx->smallend).vect;
    local_48.bigend.vect._0_8_ = *(undefined8 *)(bx->bigend).vect;
    iVar4 = (bx->bigend).vect[2];
    local_78[idir] = iVar5;
    local_48.bigend.vect[2] = iVar4;
    local_68.bigend.vect[idir] =
         iVar5 + -1 + (uint)((local_68.btype.itype >> (idir & 0x1fU) & 1) != 0);
    local_48.smallend.vect[0] = local_78[0];
    local_48.smallend.vect[1] = local_78[1];
    local_48.smallend.vect[2] = local_78[2];
    local_48.btype.itype = local_68.btype.itype;
    iVar5 = nboxes / 2;
    chop_boxes_dir(bxv,&local_68,iVar5,idir);
    chop_boxes_dir(bxv + iVar5,&local_48,nboxes - iVar5,idir);
  }
  return;
}

Assistant:

static void chop_boxes_dir (Box* bxv, const Box& bx, int nboxes, int idir)
{
    if (nboxes == 1)
    {
        *bxv = bx;
    }
    else
    {
        int chop_pnt = bx.smallEnd(idir) + bx.length(idir)/2;
        Box bxleft = bx;
        Box bxright = bxleft.chop(idir, chop_pnt);

        int nleft = nboxes / 2;
        chop_boxes_dir(bxv, bxleft, nleft, idir);

        int nright = nboxes - nleft;
        chop_boxes_dir(bxv+nleft, bxright, nright, idir);
    }
}